

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_GenerateFileOut(Vec_Str_t *vPatchLine,char *pFileNameF,char *pFileNameOut,Vec_Str_t *vPatch
                        )

{
  int iVar1;
  char *__haystack;
  FILE *__s;
  char *pcVar2;
  size_t sVar3;
  int Value;
  int nSecond;
  int nFirst;
  char *pTemp;
  char *pBuffer;
  FILE *pFileOut;
  Vec_Str_t *vPatch_local;
  char *pFileNameOut_local;
  char *pFileNameF_local;
  Vec_Str_t *vPatchLine_local;
  
  __haystack = Extra_FileReadContents(pFileNameF);
  if (__haystack != (char *)0x0) {
    __s = fopen(pFileNameOut,"wb");
    if (__s != (FILE *)0x0) {
      pcVar2 = strstr(__haystack,"endmodule");
      iVar1 = (int)pcVar2 - (int)__haystack;
      sVar3 = strlen(__haystack);
      fwrite(__haystack,(long)iVar1,1,__s);
      pcVar2 = Vec_StrArray(vPatchLine);
      fprintf(__s,"\n%s",pcVar2);
      fwrite(__haystack + iVar1,(long)((int)sVar3 - iVar1),1,__s);
      if (vPatch != (Vec_Str_t *)0x0) {
        pcVar2 = Vec_StrArray(vPatch);
        fprintf(__s,"\n%s\n",pcVar2);
      }
    }
    if (__haystack != (char *)0x0) {
      free(__haystack);
    }
    fclose(__s);
  }
  return;
}

Assistant:

void Acb_GenerateFileOut( Vec_Str_t * vPatchLine, char * pFileNameF, char * pFileNameOut, Vec_Str_t * vPatch )
{
    FILE * pFileOut;
    char * pBuffer = Extra_FileReadContents( pFileNameF );
    if ( pBuffer == NULL )
        return;
    pFileOut = fopen( pFileNameOut, "wb" );
    if ( pFileOut )
    {
        char * pTemp = strstr( pBuffer, "endmodule" );
        int nFirst = pTemp-pBuffer, nSecond = strlen(pBuffer) - nFirst;
        int Value = fwrite( pBuffer, nFirst, 1, pFileOut );
        fprintf( pFileOut, "\n%s", Vec_StrArray(vPatchLine) );
        Value = fwrite( pBuffer+nFirst, nSecond, 1, pFileOut );
        if ( vPatch )
            fprintf( pFileOut, "\n%s\n", Vec_StrArray(vPatch) );
    }
    ABC_FREE( pBuffer );
    fclose( pFileOut );
}